

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ListBoxHeader(char *label,ImVec2 *size_arg)

{
  ImGuiWindow *pIVar1;
  ImVec2 pos;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id;
  ImGuiContext *g;
  uint uVar5;
  float default_w;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect frame_bb;
  ImRect bb;
  ImRect local_88;
  undefined1 local_78 [24];
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    id = GetID(label);
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = IVar2.x;
    local_78._4_4_ = IVar2.y;
    local_78._12_4_ = extraout_XMM0_Dd;
    local_48 = *size_arg;
    uStack_40 = 0;
    default_w = CalcItemWidth();
    fVar6 = GetTextLineHeightWithSpacing();
    IVar2 = CalcItemSize(local_48,default_w,fVar6 * 7.4 + (pIVar3->Style).ItemSpacing.y);
    uVar5 = -(uint)((float)local_78._4_4_ <= IVar2.y);
    local_88.Min.x = (pIVar1->DC).CursorPos.x;
    local_88.Min.y = (pIVar1->DC).CursorPos.y;
    local_88.Max.x = IVar2.x + local_88.Min.x;
    local_88.Max.y = (float)(uVar5 & (uint)IVar2.y | ~uVar5 & local_78._4_4_) + local_88.Min.y;
    local_58.Max.x = 0.0;
    if (0.0 < (float)local_78._0_4_) {
      local_58.Max.x = (pIVar3->Style).ItemInnerSpacing.x + (float)local_78._0_4_;
    }
    local_58.Max.x = local_58.Max.x + local_88.Max.x;
    local_58.Max.y = local_88.Max.y + 0.0;
    IVar2.y = local_58.Max.y;
    IVar2.x = local_58.Max.x;
    (pIVar1->DC).LastItemRect.Min = (pIVar1->DC).CursorPos;
    (pIVar1->DC).LastItemRect.Max = IVar2;
    (pIVar3->NextItemData).Flags = 0;
    local_58.Min.x = local_88.Min.x;
    local_58.Min.y = local_88.Min.y;
    bVar4 = IsRectVisible(&local_58.Min,&local_58.Max);
    if (bVar4) {
      BeginGroup();
      if (0.0 < (float)local_78._0_4_) {
        pos.y = (pIVar3->Style).FramePadding.y + local_88.Min.y;
        pos.x = (pIVar3->Style).ItemInnerSpacing.x + local_88.Max.x;
        RenderText(pos,label,(char *)0x0,true);
      }
      local_60.y = local_88.Max.y - local_88.Min.y;
      local_60.x = local_88.Max.x - local_88.Min.x;
      BeginChildFrame(id,&local_60,0);
    }
    else {
      local_60.y = local_58.Max.y - local_58.Min.y;
      local_60.x = local_58.Max.x - local_58.Min.x;
      ItemSize(&local_60,(pIVar3->Style).FramePadding.y);
      ItemAdd(&local_58,0,&local_88);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7 items. Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.4f + style.ItemSpacing.y);
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    window->DC.LastItemRect = bb; // Forward storage for ListBoxFooter.. dodgy.
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    BeginGroup();
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}